

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void enterblock(FuncState *fs,BlockCnt *bl,lu_byte isloop)

{
  lu_byte isloop_local;
  BlockCnt *bl_local;
  FuncState *fs_local;
  
  bl->isloop = isloop;
  bl->nactvar = fs->nactvar;
  bl->firstlabel = (short)(fs->ls->dyd->label).n;
  bl->firstgoto = (short)(fs->ls->dyd->gt).n;
  bl->upval = '\0';
  bl->previous = fs->bl;
  fs->bl = bl;
  return;
}

Assistant:

static void enterblock (FuncState *fs, BlockCnt *bl, lu_byte isloop) {
  bl->isloop = isloop;
  bl->nactvar = fs->nactvar;
  bl->firstlabel = fs->ls->dyd->label.n;
  bl->firstgoto = fs->ls->dyd->gt.n;
  bl->upval = 0;
  bl->previous = fs->bl;
  fs->bl = bl;
  lua_assert(fs->freereg == fs->nactvar);
}